

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

_Bool zlib_decompress_block(ssh_decompressor *dc,uchar *block,int len,uchar **outblock,int *outlen)

{
  short sVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  zlib_decompress_ctx *dctx_00;
  ssh_compression_alg *psVar6;
  uchar *puVar7;
  undefined4 uVar8;
  uint local_7c;
  undefined4 local_78;
  int to_eat;
  int header;
  int nlen;
  int dist;
  int rep;
  int blktype;
  int code;
  coderecord *rec;
  zlib_decompress_ctx *dctx;
  int *outlen_local;
  uchar **outblock_local;
  byte *pbStack_20;
  int len_local;
  uchar *block_local;
  ssh_decompressor *dc_local;
  
  dctx_00 = (zlib_decompress_ctx *)(dc + -0x1038);
  if (dc[-1].vt != (ssh_compression_alg *)0x0) {
    __assert_fail("!dctx->outblk",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",
                  0x3e9,
                  "_Bool zlib_decompress_block(ssh_decompressor *, const unsigned char *, int, unsigned char **, int *)"
                 );
  }
  psVar6 = (ssh_compression_alg *)strbuf_new_nm();
  dc[-1].vt = psVar6;
  outblock_local._4_4_ = len;
  pbStack_20 = block;
switchD_001470e5_default:
  bVar3 = true;
  if (outblock_local._4_4_ < 1) {
    bVar3 = 0 < *(int *)&dc[-0x1002].vt;
  }
  if (!bVar3) goto LAB_00147bcd;
  for (; *(int *)&dc[-0x1002].vt < 0x18 && 0 < outblock_local._4_4_;
      outblock_local._4_4_ = outblock_local._4_4_ + -1) {
    dc[-0x1003].vt =
         (ssh_compression_alg *)
         ((long)(int)((uint)*pbStack_20 << ((byte)*(undefined4 *)&dc[-0x1002].vt & 0x1f)) |
         (ulong)dc[-0x1003].vt);
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + 8;
    pbStack_20 = pbStack_20 + 1;
  }
  switch(*(undefined4 *)&dc[-0x1033].vt) {
  case 0:
    if (*(int *)&dc[-0x1002].vt < 0x10) {
LAB_00147bcd:
      *outlen = (int)(dc[-1].vt)->compress_new;
      puVar7 = (uchar *)strbuf_to_str((strbuf *)dc[-1].vt);
      *outblock = puVar7;
      dc[-1].vt = (ssh_compression_alg *)0x0;
      return true;
    }
    psVar6 = dc[-0x1003].vt;
    uVar4 = (uint)(((ulong)dc[-0x1003].vt & 0xff) << 8);
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + -0x10;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 0x10);
    if (((((uVar4 & 0xf00) == 0x800) && ((uVar4 & 0xf000) < 0x7001)) &&
        (((ulong)psVar6 & 0x2000) == 0)) &&
       (((uint)((ulong)psVar6 >> 8) & 0xff | uVar4) % 0x1f == 0)) {
      *(undefined4 *)&dc[-0x1033].vt = 1;
      goto switchD_001470e5_default;
    }
    break;
  case 1:
    if (*(int *)&dc[-0x1002].vt < 3) goto LAB_00147bcd;
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + -1;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 1);
    psVar6 = dc[-0x1003].vt;
    uVar4 = (uint)psVar6 & 3;
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + -2;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 2);
    if (((ulong)psVar6 & 3) == 0) {
      uVar4 = *(uint *)&dc[-0x1002].vt & 7;
      *(undefined4 *)&dc[-0x1033].vt = 10;
      *(uint *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt - uVar4;
      dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> (sbyte)uVar4);
    }
    else if (uVar4 == 1) {
      dc[-0x1036].vt = (ssh_compression_alg *)dctx_00->staticlentable;
      dc[-0x1035].vt = dc[-0x1037].vt;
      *(undefined4 *)&dc[-0x1033].vt = 6;
    }
    else if (uVar4 == 2) {
      *(undefined4 *)&dc[-0x1033].vt = 2;
    }
    goto switchD_001470e5_default;
  case 2:
    if (*(int *)&dc[-0x1002].vt < 0xe) goto LAB_00147bcd;
    *(uint *)&dc[-0x1032].vt = ((uint)dc[-0x1003].vt & 0x1f) + 0x101;
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + -5;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 5);
    *(uint *)((long)&dc[-0x1032].vt + 4) = ((uint)dc[-0x1003].vt & 0x1f) + 1;
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + -5;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 5);
    *(uint *)&dc[-0x1031].vt = ((uint)dc[-0x1003].vt & 0xf) + 4;
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + -4;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 4);
    *(undefined4 *)((long)&dc[-0x1031].vt + 4) = 0;
    *(undefined4 *)&dc[-0x1033].vt = 3;
    memset((void *)((long)&dc[-0x102e].vt + 4),0,0x13);
    goto switchD_001470e5_default;
  case 3:
    if (*(int *)&dc[-0x1002].vt < 3) goto LAB_00147bcd;
    while( true ) {
      bVar3 = false;
      if (*(int *)((long)&dc[-0x1031].vt + 4) < *(int *)&dc[-0x1031].vt) {
        bVar3 = 2 < *(int *)&dc[-0x1002].vt;
      }
      if (!bVar3) break;
      psVar6 = dc[-0x1003].vt;
      iVar5 = *(int *)((long)&dc[-0x1031].vt + 4);
      *(int *)((long)&dc[-0x1031].vt + 4) = iVar5 + 1;
      *(byte *)((long)dc + ((ulong)"\x10\x11\x12"[iVar5] - 0x816c)) = (byte)psVar6 & 7;
      *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + -3;
      dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 3);
    }
    if (*(int *)((long)&dc[-0x1031].vt + 4) == *(int *)&dc[-0x1031].vt) {
      psVar6 = (ssh_compression_alg *)zlib_mktable((uchar *)((long)&dc[-0x102e].vt + 4),0x13);
      dc[-0x1034].vt = psVar6;
      *(undefined4 *)&dc[-0x1033].vt = 4;
      *(undefined4 *)((long)&dc[-0x1031].vt + 4) = 0;
    }
    goto switchD_001470e5_default;
  case 4:
    if (*(int *)&dc[-0x1032].vt + *(int *)((long)&dc[-0x1032].vt + 4) <=
        *(int *)((long)&dc[-0x1031].vt + 4)) {
      psVar6 = (ssh_compression_alg *)
               zlib_mktable((uchar *)((long)&dc[-0x102c].vt + 7),*(int *)&dc[-0x1032].vt);
      dc[-0x1036].vt = psVar6;
      psVar6 = (ssh_compression_alg *)
               zlib_mktable((uchar *)((long)dc + (long)*(int *)&dc[-0x1032].vt + -0x8159),
                            *(int *)((long)&dc[-0x1032].vt + 4));
      dc[-0x1035].vt = psVar6;
      zlib_freetable((zlib_table **)(dc + -0x1034));
      dc[-0x1034].vt = (ssh_compression_alg *)0x0;
      *(undefined4 *)&dc[-0x1033].vt = 6;
      goto switchD_001470e5_default;
    }
    iVar5 = zlib_huflookup((unsigned_long *)(dc + -0x1003),(int *)(dc + -0x1002),
                           (zlib_table *)dc[-0x1034].vt);
    if (iVar5 == -1) goto LAB_00147bcd;
    if (iVar5 != -2) {
      if (iVar5 < 0x10) {
        iVar2 = *(int *)((long)&dc[-0x1031].vt + 4);
        *(int *)((long)&dc[-0x1031].vt + 4) = iVar2 + 1;
        *(char *)((long)dc + (long)iVar2 + -0x8159) = (char)iVar5;
      }
      else {
        if (iVar5 == 0x10) {
          local_78 = 2;
        }
        else {
          local_78 = 7;
          if (iVar5 == 0x11) {
            local_78 = 3;
          }
        }
        *(undefined4 *)&dc[-0x1030].vt = local_78;
        uVar8 = 3;
        if (iVar5 == 0x12) {
          uVar8 = 0xb;
        }
        *(undefined4 *)((long)&dc[-0x1030].vt + 4) = uVar8;
        if ((iVar5 == 0x10) && (0 < *(int *)((long)&dc[-0x1031].vt + 4))) {
          local_7c = (uint)*(byte *)((long)dc +
                                    (long)(*(int *)((long)&dc[-0x1031].vt + 4) + -1) + -0x8159);
        }
        else {
          local_7c = 0;
        }
        *(uint *)((long)&dc[-0x102f].vt + 4) = local_7c;
        *(undefined4 *)&dc[-0x1033].vt = 5;
      }
      goto switchD_001470e5_default;
    }
    break;
  case 5:
    if (*(int *)&dc[-0x1002].vt < *(int *)&dc[-0x1030].vt) goto LAB_00147bcd;
    nlen = *(int *)((long)&dc[-0x1030].vt + 4) +
           ((uint)dc[-0x1003].vt & (1 << ((byte)*(undefined4 *)&dc[-0x1030].vt & 0x1f)) - 1U);
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt - *(int *)&dc[-0x1030].vt;
    dc[-0x1003].vt =
         (ssh_compression_alg *)
         ((ulong)dc[-0x1003].vt >> ((byte)*(undefined4 *)&dc[-0x1030].vt & 0x3f));
    while( true ) {
      bVar3 = false;
      if (0 < nlen) {
        bVar3 = *(int *)((long)&dc[-0x1031].vt + 4) <
                *(int *)&dc[-0x1032].vt + *(int *)((long)&dc[-0x1032].vt + 4);
      }
      if (!bVar3) break;
      *(char *)((long)dc + (long)*(int *)((long)&dc[-0x1031].vt + 4) + -0x8159) =
           (char)*(undefined4 *)((long)&dc[-0x102f].vt + 4);
      *(int *)((long)&dc[-0x1031].vt + 4) = *(int *)((long)&dc[-0x1031].vt + 4) + 1;
      nlen = nlen + -1;
    }
    *(undefined4 *)&dc[-0x1033].vt = 4;
    goto switchD_001470e5_default;
  case 6:
    iVar5 = zlib_huflookup((unsigned_long *)(dc + -0x1003),(int *)(dc + -0x1002),
                           (zlib_table *)dc[-0x1036].vt);
    if (iVar5 == -1) goto LAB_00147bcd;
    if (iVar5 != -2) {
      if (iVar5 < 0x100) {
        zlib_emit_char(dctx_00,iVar5);
        goto switchD_001470e5_default;
      }
      if (iVar5 == 0x100) {
        *(undefined4 *)&dc[-0x1033].vt = 1;
        if (dc[-0x1036].vt != (ssh_compression_alg *)dctx_00->staticlentable) {
          zlib_freetable((zlib_table **)(dc + -0x1036));
          dc[-0x1036].vt = (ssh_compression_alg *)0x0;
        }
        if (dc[-0x1035].vt != dc[-0x1037].vt) {
          zlib_freetable((zlib_table **)(dc + -0x1035));
          dc[-0x1035].vt = (ssh_compression_alg *)0x0;
        }
        goto switchD_001470e5_default;
      }
      if (iVar5 < 0x11e) {
        *(undefined4 *)&dc[-0x1033].vt = 7;
        *(int *)((long)&dc[-0x1033].vt + 4) = iVar5;
        goto switchD_001470e5_default;
      }
    }
    break;
  case 7:
    iVar5 = *(int *)((long)&dc[-0x1033].vt + 4) + -0x101;
    if (*(int *)&dc[-0x1002].vt < (int)lencodes[iVar5].extrabits) goto LAB_00147bcd;
    *(uint *)&dc[-0x102f].vt =
         lencodes[iVar5].min +
         ((uint)dc[-0x1003].vt & (1 << ((byte)lencodes[iVar5].extrabits & 0x1f)) - 1U);
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt - (int)lencodes[iVar5].extrabits;
    dc[-0x1003].vt =
         (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> ((byte)lencodes[iVar5].extrabits & 0x3f));
    *(undefined4 *)&dc[-0x1033].vt = 8;
    goto switchD_001470e5_default;
  case 8:
    iVar5 = zlib_huflookup((unsigned_long *)(dc + -0x1003),(int *)(dc + -0x1002),
                           (zlib_table *)dc[-0x1035].vt);
    if (iVar5 == -1) goto LAB_00147bcd;
    if ((iVar5 != -2) && (iVar5 < 0x1e)) {
      *(undefined4 *)&dc[-0x1033].vt = 9;
      *(int *)((long)&dc[-0x1033].vt + 4) = iVar5;
      goto switchD_001470e5_default;
    }
    break;
  case 9:
    iVar5 = *(int *)((long)&dc[-0x1033].vt + 4);
    if (*(int *)&dc[-0x1002].vt < (int)distcodes[iVar5].extrabits) goto LAB_00147bcd;
    iVar2 = distcodes[iVar5].min;
    psVar6 = dc[-0x1003].vt;
    sVar1 = distcodes[iVar5].extrabits;
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt - (int)distcodes[iVar5].extrabits;
    dc[-0x1003].vt =
         (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> ((byte)distcodes[iVar5].extrabits & 0x3f))
    ;
    *(undefined4 *)&dc[-0x1033].vt = 6;
    while (iVar5 = *(int *)&dc[-0x102f].vt, *(int *)&dc[-0x102f].vt = iVar5 + -1, iVar5 != 0) {
      zlib_emit_char(dctx_00,(uint)*(byte *)((long)dc +
                                            (long)(int)(*(int *)((long)&dc[-2].vt + 4) -
                                                        (iVar2 + ((uint)psVar6 &
                                                                 (1 << ((byte)sVar1 & 0x1f)) - 1U))
                                                       & 0x7fff) + -0x800c));
    }
    goto switchD_001470e5_default;
  case 10:
    if (*(int *)&dc[-0x1002].vt < 0x10) goto LAB_00147bcd;
    *(uint *)&dc[-0x102e].vt = (uint)dc[-0x1003].vt & 0xffff;
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + -0x10;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 0x10);
    *(undefined4 *)&dc[-0x1033].vt = 0xb;
    goto switchD_001470e5_default;
  case 0xb:
    if (*(int *)&dc[-0x1002].vt < 0x10) goto LAB_00147bcd;
    psVar6 = dc[-0x1003].vt;
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + -0x10;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 0x10);
    if (*(uint *)&dc[-0x102e].vt == ((uint)psVar6 & 0xffff ^ 0xffff)) {
      if (*(int *)&dc[-0x102e].vt == 0) {
        *(undefined4 *)&dc[-0x1033].vt = 1;
      }
      else {
        *(undefined4 *)&dc[-0x1033].vt = 0xc;
      }
      goto switchD_001470e5_default;
    }
    break;
  case 0xc:
    if (*(int *)&dc[-0x1002].vt < 8) goto LAB_00147bcd;
    zlib_emit_char(dctx_00,(uint)dc[-0x1003].vt & 0xff);
    *(int *)&dc[-0x1002].vt = *(int *)&dc[-0x1002].vt + -8;
    dc[-0x1003].vt = (ssh_compression_alg *)((ulong)dc[-0x1003].vt >> 8);
    iVar5 = *(int *)&dc[-0x102e].vt + -1;
    *(int *)&dc[-0x102e].vt = iVar5;
    if (iVar5 == 0) {
      *(undefined4 *)&dc[-0x1033].vt = 1;
    }
  default:
    goto switchD_001470e5_default;
  }
  *outblock = (uchar *)0x0;
  *outlen = 0;
  return false;
}

Assistant:

bool zlib_decompress_block(ssh_decompressor *dc,
                           const unsigned char *block, int len,
                           unsigned char **outblock, int *outlen)
{
    struct zlib_decompress_ctx *dctx =
        container_of(dc, struct zlib_decompress_ctx, dc);
    const coderecord *rec;
    int code, blktype, rep, dist, nlen, header;
    static const unsigned char lenlenmap[] = {
        16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15
    };

    assert(!dctx->outblk);
    dctx->outblk = strbuf_new_nm();

    while (len > 0 || dctx->nbits > 0) {
        while (dctx->nbits < 24 && len > 0) {
            dctx->bits |= (*block++) << dctx->nbits;
            dctx->nbits += 8;
            len--;
        }
        switch (dctx->state) {
          case START:
            /* Expect 16-bit zlib header. */
            if (dctx->nbits < 16)
                goto finished;         /* done all we can */

            /*
             * The header is stored as a big-endian 16-bit integer,
             * in contrast to the general little-endian policy in
             * the rest of the format :-(
             */
            header = (((dctx->bits & 0xFF00) >> 8) |
                      ((dctx->bits & 0x00FF) << 8));
            EATBITS(16);

            /*
             * Check the header:
             *
             *  - bits 8-11 should be 1000 (Deflate/RFC1951)
             *  - bits 12-15 should be at most 0111 (window size)
             *  - bit 5 should be zero (no dictionary present)
             *  - we don't care about bits 6-7 (compression rate)
             *  - bits 0-4 should be set up to make the whole thing
             *    a multiple of 31 (checksum).
             */
            if ((header & 0x0F00) != 0x0800 ||
                (header & 0xF000) >  0x7000 ||
                (header & 0x0020) != 0x0000 ||
                (header % 31) != 0)
                goto decode_error;

            dctx->state = OUTSIDEBLK;
            break;
          case OUTSIDEBLK:
            /* Expect 3-bit block header. */
            if (dctx->nbits < 3)
                goto finished;         /* done all we can */
            EATBITS(1);
            blktype = dctx->bits & 3;
            EATBITS(2);
            if (blktype == 0) {
                int to_eat = dctx->nbits & 7;
                dctx->state = UNCOMP_LEN;
                EATBITS(to_eat);       /* align to byte boundary */
            } else if (blktype == 1) {
                dctx->currlentable = dctx->staticlentable;
                dctx->currdisttable = dctx->staticdisttable;
                dctx->state = INBLK;
            } else if (blktype == 2) {
                dctx->state = TREES_HDR;
            }
            break;
          case TREES_HDR:
            /*
             * Dynamic block header. Five bits of HLIT, five of
             * HDIST, four of HCLEN.
             */
            if (dctx->nbits < 5 + 5 + 4)
                goto finished;         /* done all we can */
            dctx->hlit = 257 + (dctx->bits & 31);
            EATBITS(5);
            dctx->hdist = 1 + (dctx->bits & 31);
            EATBITS(5);
            dctx->hclen = 4 + (dctx->bits & 15);
            EATBITS(4);
            dctx->lenptr = 0;
            dctx->state = TREES_LENLEN;
            memset(dctx->lenlen, 0, sizeof(dctx->lenlen));
            break;
          case TREES_LENLEN:
            if (dctx->nbits < 3)
                goto finished;
            while (dctx->lenptr < dctx->hclen && dctx->nbits >= 3) {
                dctx->lenlen[lenlenmap[dctx->lenptr++]] =
                    (unsigned char) (dctx->bits & 7);
                EATBITS(3);
            }
            if (dctx->lenptr == dctx->hclen) {
                dctx->lenlentable = zlib_mktable(dctx->lenlen, 19);
                dctx->state = TREES_LEN;
                dctx->lenptr = 0;
            }
            break;
          case TREES_LEN:
            if (dctx->lenptr >= dctx->hlit + dctx->hdist) {
                dctx->currlentable = zlib_mktable(dctx->lengths, dctx->hlit);
                dctx->currdisttable = zlib_mktable(dctx->lengths + dctx->hlit,
                                                  dctx->hdist);
                zlib_freetable(&dctx->lenlentable);
                dctx->lenlentable = NULL;
                dctx->state = INBLK;
                break;
            }
            code =
                zlib_huflookup(&dctx->bits, &dctx->nbits, dctx->lenlentable);
            if (code == -1)
                goto finished;
            if (code == -2)
                goto decode_error;
            if (code < 16)
                dctx->lengths[dctx->lenptr++] = code;
            else {
                dctx->lenextrabits = (code == 16 ? 2 : code == 17 ? 3 : 7);
                dctx->lenaddon = (code == 18 ? 11 : 3);
                dctx->lenrep = (code == 16 && dctx->lenptr > 0 ?
                               dctx->lengths[dctx->lenptr - 1] : 0);
                dctx->state = TREES_LENREP;
            }
            break;
          case TREES_LENREP:
            if (dctx->nbits < dctx->lenextrabits)
                goto finished;
            rep =
                dctx->lenaddon +
                (dctx->bits & ((1 << dctx->lenextrabits) - 1));
            EATBITS(dctx->lenextrabits);
            while (rep > 0 && dctx->lenptr < dctx->hlit + dctx->hdist) {
                dctx->lengths[dctx->lenptr] = dctx->lenrep;
                dctx->lenptr++;
                rep--;
            }
            dctx->state = TREES_LEN;
            break;
          case INBLK:
            code =
                zlib_huflookup(&dctx->bits, &dctx->nbits, dctx->currlentable);
            if (code == -1)
                goto finished;
            if (code == -2)
                goto decode_error;
            if (code < 256)
                zlib_emit_char(dctx, code);
            else if (code == 256) {
                dctx->state = OUTSIDEBLK;
                if (dctx->currlentable != dctx->staticlentable) {
                    zlib_freetable(&dctx->currlentable);
                    dctx->currlentable = NULL;
                }
                if (dctx->currdisttable != dctx->staticdisttable) {
                    zlib_freetable(&dctx->currdisttable);
                    dctx->currdisttable = NULL;
                }
            } else if (code < 286) {
                dctx->state = GOTLENSYM;
                dctx->sym = code;
            } else {
                /* literal/length symbols 286 and 287 are invalid */
                goto decode_error;
            }
            break;
          case GOTLENSYM:
            rec = &lencodes[dctx->sym - 257];
            if (dctx->nbits < rec->extrabits)
                goto finished;
            dctx->len =
                rec->min + (dctx->bits & ((1 << rec->extrabits) - 1));
            EATBITS(rec->extrabits);
            dctx->state = GOTLEN;
            break;
          case GOTLEN:
            code =
                zlib_huflookup(&dctx->bits, &dctx->nbits,
                               dctx->currdisttable);
            if (code == -1)
                goto finished;
            if (code == -2)
                goto decode_error;
            if (code >= 30)            /* dist symbols 30 and 31 are invalid */
                goto decode_error;
            dctx->state = GOTDISTSYM;
            dctx->sym = code;
            break;
          case GOTDISTSYM:
            rec = &distcodes[dctx->sym];
            if (dctx->nbits < rec->extrabits)
                goto finished;
            dist = rec->min + (dctx->bits & ((1 << rec->extrabits) - 1));
            EATBITS(rec->extrabits);
            dctx->state = INBLK;
            while (dctx->len--)
                zlib_emit_char(dctx, dctx->window[(dctx->winpos - dist) &
                                                  (WINSIZE - 1)]);
            break;
          case UNCOMP_LEN:
            /*
             * Uncompressed block. We expect to see a 16-bit LEN.
             */
            if (dctx->nbits < 16)
                goto finished;
            dctx->uncomplen = dctx->bits & 0xFFFF;
            EATBITS(16);
            dctx->state = UNCOMP_NLEN;
            break;
          case UNCOMP_NLEN:
            /*
             * Uncompressed block. We expect to see a 16-bit NLEN,
             * which should be the one's complement of the previous
             * LEN.
             */
            if (dctx->nbits < 16)
                goto finished;
            nlen = dctx->bits & 0xFFFF;
            EATBITS(16);
            if (dctx->uncomplen != (nlen ^ 0xFFFF))
                goto decode_error;
            if (dctx->uncomplen == 0)
                dctx->state = OUTSIDEBLK;       /* block is empty */
            else
                dctx->state = UNCOMP_DATA;
            break;
          case UNCOMP_DATA:
            if (dctx->nbits < 8)
                goto finished;
            zlib_emit_char(dctx, dctx->bits & 0xFF);
            EATBITS(8);
            if (--dctx->uncomplen == 0)
                dctx->state = OUTSIDEBLK;       /* end of uncompressed block */
            break;
        }
    }

  finished:
    *outlen = dctx->outblk->len;
    *outblock = (unsigned char *)strbuf_to_str(dctx->outblk);
    dctx->outblk = NULL;
    return true;

  decode_error:
    *outblock = NULL;
    *outlen = 0;
    return false;
}